

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O0

int bgzf_close(BGZF *fp)

{
  int iVar1;
  ssize_t sVar2;
  int block_length;
  int ret;
  BGZF *fp_local;
  
  if (fp == (BGZF *)0x0) {
    return -1;
  }
  if (((*(int *)fp << 0xe) >> 0x1e != 0) && ((*(int *)fp << 1) >> 0x1e != 0)) {
    iVar1 = bgzf_flush(fp);
    if (iVar1 != 0) {
      return -1;
    }
    *(uint *)fp = *(uint *)fp & 0xe00fffff | 0x1ff00000;
    iVar1 = deflate_block(fp,0);
    sVar2 = hwrite(fp->fp,fp->compressed_block,(long)iVar1);
    if ((sVar2 < 0) || (iVar1 = hflush(fp->fp), iVar1 != 0)) {
      *(uint *)fp = *(uint *)fp & 0xffff0000 | *(uint *)fp & 0xffff | 4;
      return -1;
    }
    if (fp->mt != (bgzf_mtaux_t *)0x0) {
      mt_destroy(fp->mt);
    }
  }
  if (*(int *)fp < 0) {
    if ((*(int *)fp << 0xe) >> 0x1e == 0) {
      inflateEnd(fp->gz_stream);
    }
    else {
      deflateEnd(fp->gz_stream);
    }
    free(fp->gz_stream);
  }
  iVar1 = hclose(fp->fp);
  if (iVar1 == 0) {
    bgzf_index_destroy(fp);
    free(fp->uncompressed_block);
    free(fp->compressed_block);
    free_cache(fp);
    free(fp);
    fp_local._4_4_ = 0;
  }
  else {
    fp_local._4_4_ = -1;
  }
  return fp_local._4_4_;
}

Assistant:

int bgzf_close(BGZF* fp)
{
    int ret, block_length;
    if (fp == 0) return -1;
    if (fp->is_write && fp->is_compressed) {
        if (bgzf_flush(fp) != 0) return -1;
        fp->compress_level = -1;
        block_length = deflate_block(fp, 0); // write an empty block
        if (hwrite(fp->fp, fp->compressed_block, block_length) < 0
            || hflush(fp->fp) != 0) {
            fp->errcode |= BGZF_ERR_IO;
            return -1;
        }
#ifdef BGZF_MT
        if (fp->mt) mt_destroy(fp->mt);
#endif
    }
    if ( fp->is_gzip )
    {
        if (!fp->is_write) (void)inflateEnd(fp->gz_stream);
        else (void)deflateEnd(fp->gz_stream);
        free(fp->gz_stream);
    }
    ret = hclose(fp->fp);
    if (ret != 0) return -1;
    bgzf_index_destroy(fp);
    free(fp->uncompressed_block);
    free(fp->compressed_block);
    free_cache(fp);
    free(fp);
    return 0;
}